

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

void __thiscall LongReadsMapper::read_read_paths(LongReadsMapper *this,string *filename)

{
  ifstream ifs;
  
  std::ifstream::ifstream(&ifs,(string *)filename,_S_bin);
  sdglib::read_flat_vectorvector<long>(&ifs,&this->read_paths);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void LongReadsMapper::read_read_paths(std::string filename) {
    std::ifstream ifs(filename, std::ios_base::binary);
    sdglib::read_flat_vectorvector(ifs,read_paths);
}